

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O3

optional<cmUVJobServerClient> __thiscall
cmUVJobServerClient::Connect
          (cmUVJobServerClient *this,uv_loop_t *loop,function<void_()> *onToken,
          function<void_(int)> *onDisconnect)

{
  string *__return_storage_ptr__;
  element_type *peVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  cmUVJobServerClient this_00;
  undefined8 *puVar10;
  uv_stream_t *puVar11;
  uv_pipe_s *handle;
  element_type *peVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar13;
  basic_string_view<char,_std::char_traits<char>_> *pbVar14;
  string_view str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  optional<cmUVJobServerClient> oVar15;
  basic_string_view<char,_std::char_traits<char>_> __str;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> auth;
  int reader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  makeflags;
  undefined1 local_128 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e0;
  undefined1 local_c0;
  undefined1 local_b4 [4];
  _Storage<cmUVJobServerClient,_false> local_b0;
  element_type *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  char *pcStack_50;
  ulong local_48;
  char *pcStack_40;
  
  local_b0 = (_Storage<cmUVJobServerClient,_false>)this;
  local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)onToken;
  local_98 = (element_type *)onDisconnect;
  this_00.Impl_._M_t.
  super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
  .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
       (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
       operator_new(0xb8);
  Impl::Impl((Impl *)this_00.Impl_._M_t.
                     super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                     .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl,loop);
  *(undefined ***)
   this_00.Impl_._M_t.
   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
   ._M_t.
   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
       &PTR__ImplPosix_00b1e360;
  *(undefined4 *)
   &((Impl *)((long)this_00.Impl_._M_t.
                    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))
    ->_vptr_Impl = 0;
  ((Impl *)((long)this_00.Impl_._M_t.
                  super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                  .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))->
  Loop = (uv_loop_t *)0x0;
  (((Impl *)((long)this_00.Impl_._M_t.
                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))
  ->ImplicitToken).super_uv_handle_ptr_<uv_idle_s>.super_uv_handle_ptr_base_<uv_idle_s>.handle.
  super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (((Impl *)((long)this_00.Impl_._M_t.
                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))
  ->ImplicitToken).super_uv_handle_ptr_<uv_idle_s>.super_uv_handle_ptr_base_<uv_idle_s>.handle.
  super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &(((Impl *)((long)this_00.Impl_._M_t.
                     super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                     .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68)
     )->OnToken).super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(((Impl *)((long)this_00.Impl_._M_t.
                            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl
                     + 0x68))->OnToken).super__Function_base._M_functor + 8) = 0;
  (((Impl *)((long)this_00.Impl_._M_t.
                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))
  ->OnToken).super__Function_base._M_manager = (_Manager_type)0x0;
  puVar10 = (undefined8 *)operator_new(0x30);
  puVar10[1] = 0x100000001;
  *puVar10 = &PTR___Sp_counted_ptr_inplace_00b1e3f0;
  puVar10[3] = 0;
  ((_Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_> *
   )(puVar10 + 2))->super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false> =
       (_Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>)
       this_00.Impl_._M_t.
       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
  puVar10[5] = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx:204:56)>
               ::_M_invoke;
  puVar10[4] = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx:204:56)>
               ::_M_manager;
  *(undefined8 **)
   &(((Impl *)((long)this_00.Impl_._M_t.
                     super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                     .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68)
     )->OnDisconnect).super__Function_base._M_functor = puVar10;
  (((Impl *)((long)this_00.Impl_._M_t.
                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x68))
  ->OnToken)._M_invoker = (_Invoker_type)(puVar10 + 2);
  *(undefined2 *)
   ((long)&(((Impl *)((long)this_00.Impl_._M_t.
                            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl
                     + 0x68))->OnDisconnect).super__Function_base._M_functor + 8) = 0x2e;
  if (((anonymous_namespace)::ImplPosix::Connect()::prefixes == '\0') &&
     (iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::ImplPosix::Connect()::prefixes),
     iVar8 != 0)) {
    local_48 = 2;
    pcStack_40 = "-J";
    local_58 = (undefined1  [8])0x10;
    pcStack_50 = "--jobserver-fds=";
    local_68._0_8_ = &DAT_00000011;
    local_68._8_8_ = "--jobserver-auth=";
    __l._M_len = 3;
    __l._M_array = (iterator)local_68;
    local_128._24_8_ =
         this_00.Impl_._M_t.
         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&(anonymous_namespace)::ImplPosix::Connect()::prefixes,__l,
             (allocator_type *)&local_e0);
    __cxa_atexit(std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::~vector,&(anonymous_namespace)::ImplPosix::Connect()::prefixes,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::ImplPosix::Connect()::prefixes);
    this_00.Impl_._M_t.
    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         local_128._24_8_;
  }
  local_e0.field_2._M_allocated_capacity = 0x47414c46454b414d;
  local_e0.field_2._8_2_ = 0x53;
  local_e0._M_string_length = 9;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  cmSystemTools::GetEnvVar
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1));
  }
  if ((bool)(byte)local_48 != false) {
    local_c0 = None;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._24_8_ =
         this_00.Impl_._M_t.
         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
    cmSystemTools::ParseUnixCommandLine((char *)local_68._0_8_,&local_88);
    local_90._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_88.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__ = (string *)(local_128 + 0x20);
    peVar12 = (element_type *)
              local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pbVar4 = DAT_00b441e0;
      if (peVar12 == (element_type *)local_90._M_pi) break;
      local_a8 = peVar12;
      if ((anonymous_namespace)::ImplPosix::Connect()::prefixes != DAT_00b441e0) {
        peVar1 = *(element_type **)&peVar12[-1].delayed_error;
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)peVar12[-1].queued_fds;
        pbVar14 = (anonymous_namespace)::ImplPosix::Connect()::prefixes;
        do {
          __n1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pbVar14->_M_len;
          local_128._32_8_ = paVar2;
          local_128._40_8_ = peVar1;
          iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             __return_storage_ptr__,0,(size_type)__n1,*pbVar14);
          if (iVar8 == 0) {
            str._M_len = (long)paVar2 - (long)__n1;
            if (paVar2 < __n1) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",__n1,paVar2);
            }
            str._M_str = (char *)((long)__n1 + (long)peVar1);
            cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,str);
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_e0,__return_storage_ptr__);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._32_8_ != &local_f8) {
              operator_delete((void *)local_128._32_8_,(ulong)(local_f8._M_allocated_capacity + 1));
            }
            break;
          }
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 != pbVar4);
      }
      peVar12 = (element_type *)&local_a8[-1].delayed_error;
    } while (local_c0 != FDs);
    this_00.Impl_._M_t.
    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl =
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         (unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>)
         local_128._24_8_;
    if ((local_c0 & FDs) != None) {
      local_128._32_8_ = local_e0._M_string_length;
      local_128._40_8_ = local_e0._M_dataplus._M_p;
      __str._M_str = "fifo:";
      __str._M_len = 5;
      iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_128 + 0x20),0,5,
                         __str);
      if (iVar8 == 0) {
        std::__cxx11::string::substr((ulong)(local_128 + 0x20),(ulong)&local_e0);
        iVar8 = open((char *)local_128._32_8_,2);
        if (-1 < iVar8) {
          local_128._0_8_ = (element_type *)0x0;
          local_128._8_8_ = (uv_loop_t *)0x0;
          ::cm::uv_pipe_ptr::init
                    ((uv_pipe_ptr *)local_128,
                     (EVP_PKEY_CTX *)
                     *(uv_loop_t **)
                      ((long)this_00.Impl_._M_t.
                             super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                             .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl
                      + 8));
          handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                             ((uv_handle_ptr_<uv_pipe_s> *)local_128);
          iVar9 = uv_pipe_open(handle,iVar8);
          if (iVar9 == 0) {
            bVar7 = ::cm::uv_handle_ptr_base_::operator_cast_to_bool
                              ((uv_handle_ptr_base_<uv_pipe_s> *)local_128);
            if (bVar7) {
              puVar11 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_128);
              iVar8 = uv_is_readable(puVar11);
              if (iVar8 != 0) {
                puVar11 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_128)
                ;
                iVar8 = uv_is_writable(puVar11);
                uVar5 = local_128._8_8_;
                uVar13 = local_128._0_8_;
                if (iVar8 != 0) {
                  local_128._0_8_ = (element_type *)0x0;
                  local_128._8_8_ = (uv_loop_t *)0x0;
                  uVar6 = local_128._8_8_;
                  p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             ((long)this_00.Impl_._M_t.
                                    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                    _M_head_impl + 0x90))->_M_use_count;
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)this_00.Impl_._M_t.
                         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                  0x90))->_vptr__Sp_counted_base = (_func_int **)uVar13;
                  local_128._8_4_ = (undefined4)uVar5;
                  local_128._12_4_ = SUB84(uVar5,4);
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)this_00.Impl_._M_t.
                         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                  0x90))->_M_use_count = local_128._8_4_;
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)this_00.Impl_._M_t.
                         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                  0x90))->_M_weak_count = local_128._12_4_;
                  local_128._8_8_ = uVar6;
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                  }
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)this_00.Impl_._M_t.
                         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                  0x60))->_M_use_count = 2;
                }
              }
            }
          }
          else {
            close(iVar8);
          }
          ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                    ((uv_handle_ptr_base_<uv_pipe_s> *)local_128);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._32_8_ != &local_f8) {
          operator_delete((void *)local_128._32_8_,(ulong)(local_f8._M_allocated_capacity + 1));
        }
      }
      else {
        iVar8 = __isoc99_sscanf(local_e0._M_dataplus._M_p,"%d,%d",local_b4);
        if (iVar8 == 2) {
          anon_unknown.dwarf_665b50::ImplPosix::OpenFD
                    ((ImplPosix *)(local_128 + 0x20),
                     (int)this_00.Impl_._M_t.
                          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl);
          anon_unknown.dwarf_665b50::ImplPosix::OpenFD
                    ((ImplPosix *)local_128,
                     (int)this_00.Impl_._M_t.
                          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl);
          bVar7 = ::cm::uv_handle_ptr_base_::operator_cast_to_bool
                            ((uv_handle_ptr_base_<uv_pipe_s> *)(local_128 + 0x20));
          if (bVar7) {
            puVar11 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                                ((uv_pipe_ptr *)(local_128 + 0x20));
            iVar8 = uv_is_readable(puVar11);
            if ((iVar8 != 0) &&
               (bVar7 = ::cm::uv_handle_ptr_base_::operator_cast_to_bool
                                  ((uv_handle_ptr_base_<uv_pipe_s> *)local_128), bVar7)) {
              puVar11 = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_((uv_pipe_ptr *)local_128);
              iVar8 = uv_is_writable(puVar11);
              uVar5 = local_128._40_8_;
              uVar13 = local_128._32_8_;
              if (iVar8 != 0) {
                local_128._32_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_128._40_8_ = (element_type *)0x0;
                peVar1 = (((uv_idle_ptr *)
                          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)this_00.Impl_._M_t.
                                  super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                  .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                  _M_head_impl + 0x70))->_M_use_count)->
                         super_uv_handle_ptr_<uv_idle_s>).super_uv_handle_ptr_base_<uv_idle_s>.
                         handle.super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)this_00.Impl_._M_t.
                       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                0x70))->_vptr__Sp_counted_base = (_func_int **)uVar13;
                (((uv_idle_ptr *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)this_00.Impl_._M_t.
                         super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                         .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                  0x70))->_M_use_count)->super_uv_handle_ptr_<uv_idle_s>).
                super_uv_handle_ptr_base_<uv_idle_s>.handle.
                super___shared_ptr<uv_idle_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)uVar5;
                if (peVar1 != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1);
                }
                uVar5 = local_128._8_8_;
                uVar13 = local_128._0_8_;
                local_128._0_8_ = (element_type *)0x0;
                local_128._8_8_ = (uv_loop_t *)0x0;
                uVar6 = local_128._8_8_;
                p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)this_00.Impl_._M_t.
                                  super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                  .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                  _M_head_impl + 0x80))->_M_use_count;
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)this_00.Impl_._M_t.
                       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                0x80))->_vptr__Sp_counted_base = (_func_int **)uVar13;
                local_128._8_4_ = (undefined4)uVar5;
                local_128._12_4_ = SUB84(uVar5,4);
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)this_00.Impl_._M_t.
                       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                0x80))->_M_use_count = local_128._8_4_;
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)this_00.Impl_._M_t.
                       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                0x80))->_M_weak_count = local_128._12_4_;
                local_128._8_8_ = uVar6;
                if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                }
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)this_00.Impl_._M_t.
                       super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                       .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                0x60))->_M_use_count = 1;
              }
            }
          }
          ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                    ((uv_handle_ptr_base_<uv_pipe_s> *)local_128);
          ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
                    ((uv_handle_ptr_base_<uv_pipe_s> *)(local_128 + 0x20));
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    if ((local_c0 == FDs) &&
       (local_c0 = None,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
      operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  if ((((byte)local_48 & 1) != 0) &&
     (local_48 = local_48 & 0xffffffffffffff00, (undefined1 *)local_68._0_8_ != local_58)) {
    operator_delete((void *)local_68._0_8_,(long)local_58 + 1);
  }
  bVar7 = *(int *)&((Impl *)((long)this_00.Impl_._M_t.
                                   super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                                   .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>.
                                   _M_head_impl + 0x68))->_vptr_Impl == 0;
  if (bVar7) {
    (**(code **)(*(long *)this_00.Impl_._M_t.
                          super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                          .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl +
                8))(this_00.Impl_._M_t.
                    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl);
    uVar13 = extraout_RDX_00;
  }
  else {
    std::function<void_()>::operator=
              ((function<void_()> *)
               ((long)this_00.Impl_._M_t.
                      super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                      .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x20
               ),(function<void_()> *)local_a0._M_pi);
    std::function<void_(int)>::operator=
              ((function<void_(int)> *)
               ((long)this_00.Impl_._M_t.
                      super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                      .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl + 0x40
               ),(function<void_(int)> *)local_98);
    *(unique_ptr<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_> *)
     local_b0 = this_00.Impl_._M_t.
                super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
                .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl;
    uVar13 = extraout_RDX;
  }
  *(bool *)&(((cmUVJobServerClient *)(local_b0.field2 + 8))->Impl_)._M_t.
            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl = !bVar7;
  oVar15.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._8_8_ = uVar13;
  oVar15.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._M_payload.field2 = local_b0.field2;
  return (optional<cmUVJobServerClient>)
         oVar15.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
         super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
         super__Optional_payload_base<cmUVJobServerClient>;
}

Assistant:

cm::optional<cmUVJobServerClient> cmUVJobServerClient::Connect(
  uv_loop_t& loop, std::function<void()> onToken,
  std::function<void(int)> onDisconnect)
{
#if defined(_WIN32)
  // FIXME: Windows job server client not yet implemented.
  static_cast<void>(loop);
  static_cast<void>(onToken);
  static_cast<void>(onDisconnect);
#else
  auto impl = cm::make_unique<ImplPosix>(loop);
  if (impl && impl->IsConnected()) {
    impl->OnToken = std::move(onToken);
    impl->OnDisconnect = std::move(onDisconnect);
    return cmUVJobServerClient(std::move(impl));
  }
#endif
  return cm::nullopt;
}